

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall
wasm::WasmBinaryWriter::writeInlineBuffer(WasmBinaryWriter *this,char *data,size_t size)

{
  undefined8 in_RAX;
  size_t in_RCX;
  size_t sVar1;
  LEB<unsigned_int,_unsigned_char> local_38;
  undefined4 uStack_34;
  
  _local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),(int)size);
  LEB<unsigned_int,_unsigned_char>::write(&local_38,(int)this->o,(void *)size,in_RCX);
  if (size != 0) {
    sVar1 = 0;
    do {
      _local_38 = CONCAT17(data[sVar1],_local_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                 (uchar *)((long)&uStack_34 + 3));
      sVar1 = sVar1 + 1;
    } while (size != sVar1);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeInlineBuffer(const char* data, size_t size) {
  o << U32LEB(size);
  writeData(data, size);
}